

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O2

void cio_linux_eventloop_remove(cio_eventloop *loop,cio_event_notifier *evn)

{
  uint uVar1;
  uint uVar2;
  
  epoll_ctl(loop->epoll_fd,2,evn->fd,(epoll_event *)0x0);
  uVar2 = loop->event_counter + 1;
  do {
    uVar1 = uVar2;
    if (loop->num_events <= uVar1) goto LAB_00102297;
    uVar2 = uVar1 + 1;
  } while ((cio_event_notifier *)loop->epoll_events[uVar1].data.ptr != evn);
  memmove(loop->epoll_events + uVar1,loop->epoll_events + uVar2,
          (ulong)(loop->num_events - uVar2) * 0xc);
  loop->num_events = loop->num_events - 1;
LAB_00102297:
  if (loop->current_ev == evn) {
    loop->current_ev = (cio_event_notifier *)0x0;
  }
  return;
}

Assistant:

void cio_linux_eventloop_remove(struct cio_eventloop *loop, const struct cio_event_notifier *evn)
{
	epoll_ctl(loop->epoll_fd, EPOLL_CTL_DEL, evn->fd, NULL);
	erase_pending_event(loop, evn);
	if (loop->current_ev == evn) {
		loop->current_ev = NULL;
	}
}